

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.h
# Opt level: O0

void __thiscall mkvparser::Projection::Projection(Projection *this)

{
  Projection *this_local;
  
  this->type = kTypeNotPresent;
  this->private_data = (uchar *)0x0;
  this->private_data_length = 0;
  this->pose_yaw = 3.4028235e+38;
  this->pose_pitch = 3.4028235e+38;
  this->pose_roll = 3.4028235e+38;
  return;
}

Assistant:

Projection()
      : type(kTypeNotPresent),
        private_data(NULL),
        private_data_length(0),
        pose_yaw(kValueNotPresent),
        pose_pitch(kValueNotPresent),
        pose_roll(kValueNotPresent) {}